

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnet.h
# Opt level: O0

void __thiscall TadsServerThread::~TadsServerThread(TadsServerThread *this)

{
  ~TadsServerThread((TadsServerThread *)&this[-1].mutex);
  return;
}

Assistant:

~TadsServerThread()
    {
        /* release our resources */
        socket->release_ref();
        listener->release_ref();
        mutex->release_ref();
        state->release_ref();
        if (client_ip != 0)
            t3free(client_ip);
    }